

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

bool duckdb::ParsedExpressionIsAggregate(Binder *binder,ParsedExpression *expr)

{
  FunctionExpression *pFVar1;
  bool is_aggregate;
  EntryLookupInfo lookup_info;
  optional_ptr<duckdb::CatalogEntry,_true> local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  if ((expr->super_BaseExpression).expression_class == FUNCTION) {
    pFVar1 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
    EntryLookupInfo::EntryLookupInfo
              ((EntryLookupInfo *)&local_48,AGGREGATE_FUNCTION_ENTRY,&pFVar1->function_name,
               (QueryErrorContext)0xffffffffffffffff);
    local_50 = CatalogEntryRetriever::GetEntry
                         (&binder->entry_retriever,&pFVar1->catalog,&pFVar1->schema,
                          (EntryLookupInfo *)&local_48,RETURN_NULL);
    if ((local_50.ptr != (CatalogEntry *)0x0) &&
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_50),
       (local_50.ptr)->type == AGGREGATE_FUNCTION_ENTRY)) {
      return true;
    }
  }
  local_48._M_unused._M_object = &local_50;
  local_50.ptr = local_50.ptr & 0xffffffffffffff00;
  pcStack_30 = ::std::
               _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:251:12)>
               ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:251:12)>
             ::_M_manager;
  local_48._8_8_ = binder;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return (bool)local_50.ptr._0_1_;
}

Assistant:

static bool ParsedExpressionIsAggregate(Binder &binder, const ParsedExpression &expr) {
	if (expr.GetExpressionClass() == ExpressionClass::FUNCTION) {
		auto &function = expr.Cast<FunctionExpression>();
		QueryErrorContext error_context;

		EntryLookupInfo lookup_info(CatalogType::AGGREGATE_FUNCTION_ENTRY, function.function_name, error_context);
		auto entry =
		    binder.GetCatalogEntry(function.catalog, function.schema, lookup_info, OnEntryNotFound::RETURN_NULL);
		if (entry && entry->type == CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			return true;
		}
	}
	bool is_aggregate = false;
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { is_aggregate |= ParsedExpressionIsAggregate(binder, child); });
	return is_aggregate;
}